

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlParserErrors
xmlCreateCharEncodingHandler
          (char *name,xmlCharEncFlags flags,xmlCharEncConvImpl impl,void *implCtxt,
          xmlCharEncodingHandler **out)

{
  xmlParserErrors xVar1;
  char *name_00;
  void *pvVar2;
  uint uVar3;
  
  xVar1 = XML_ERR_ARGUMENT;
  if ((out != (xmlCharEncodingHandler **)0x0) &&
     (*out = (xmlCharEncodingHandler *)0x0, flags != 0 && name != (char *)0x0)) {
    name_00 = xmlGetEncodingAlias(name);
    if (name_00 == (char *)0x0) {
      name_00 = name;
    }
    pvVar2 = bsearch(name_00,xmlEncTable,0x25,0x10,xmlCompareEncTableEntries);
    if (pvVar2 == (void *)0x0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = *(uint *)((long)pvVar2 + 8);
    }
    xVar1 = XML_ERR_OK;
    if (uVar3 != 1) {
      if (uVar3 - 1 < 0x1e) {
        if ((((flags & XML_ENC_INPUT) == 0) ||
            (defaultHandlers[uVar3].input.func != (xmlCharEncConvFunc)0x0)) &&
           (((flags & XML_ENC_OUTPUT) == 0 ||
            (defaultHandlers[uVar3].output.func != (xmlCharEncConvFunc)0x0)))) {
          *out = defaultHandlers + uVar3;
          return XML_ERR_OK;
        }
      }
      xVar1 = xmlFindExtraHandler(name,name_00,flags,impl,implCtxt,out);
      return xVar1;
    }
  }
  return xVar1;
}

Assistant:

xmlParserErrors
xmlCreateCharEncodingHandler(const char *name, xmlCharEncFlags flags,
                             xmlCharEncConvImpl impl, void *implCtxt,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;
    const char *norig, *nalias;
    xmlCharEncoding enc;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if ((name == NULL) || (flags == 0))
        return(XML_ERR_ARGUMENT);

    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    enc = xmlParseCharEncodingInternal(name);

    /* Return NULL handler for UTF-8 */
    if (enc == XML_CHAR_ENCODING_UTF8)
        return(XML_ERR_OK);

    if ((enc > 0) && ((size_t) enc < NUM_DEFAULT_HANDLERS)) {
        handler = &defaultHandlers[enc];
        if ((((flags & XML_ENC_INPUT) == 0) || (handler->input.func)) &&
            (((flags & XML_ENC_OUTPUT) == 0) || (handler->output.func))) {
            *out = (xmlCharEncodingHandler *) handler;
            return(XML_ERR_OK);
        }
    }

    return(xmlFindExtraHandler(norig, name, flags, impl, implCtxt, out));
}